

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

BOOL __thiscall
Js::GlobalObject::DeleteItem(GlobalObject *this,uint32 index,PropertyOperationFlags flags)

{
  BOOL BVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  
  BVar1 = DynamicObject::DeleteItem((DynamicObject *)this,index,flags);
  BVar2 = 1;
  if (BVar1 == 0) {
    pRVar4 = (this->directHostObject).ptr;
    if ((pRVar4 != (RecyclableObject *)0x0) ||
       (pRVar4 = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr,
       pRVar4 != (RecyclableObject *)0x0)) {
      iVar3 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2a])(pRVar4,(ulong)index,(ulong)flags);
      return iVar3;
    }
    BVar2 = 0;
  }
  return BVar2;
}

Assistant:

BOOL GlobalObject::DeleteItem(uint32 index, PropertyOperationFlags flags)
    {
        if (DynamicObject::DeleteItem(index, flags))
        {
            return TRUE;
        }

        if (this->directHostObject)
        {
            return this->directHostObject->DeleteItem(index, flags);
        }

        if (this->hostObject)
        {
            return this->hostObject->DeleteItem(index, flags);
        }
        return FALSE;
    }